

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int ffsnul(fitsfile *fptr,int colnum,char *nulstring,int *status)

{
  int iVar1;
  int local_3c;
  tcolumn *ptStack_38;
  int hdutype;
  tcolumn *colptr;
  int *status_local;
  char *nulstring_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    colptr = (tcolumn *)status;
    status_local = (int *)nulstring;
    nulstring_local._4_4_ = colnum;
    pfStack_18 = fptr;
    iVar1 = ffghdt(fptr,&local_3c,status);
    if (iVar1 < 1) {
      if (local_3c == 1) {
        ptStack_38 = pfStack_18->Fptr->tableptr + (nulstring_local._4_4_ + -1);
        ptStack_38->strnull[0] = '\0';
        strncat(ptStack_38->strnull,(char *)status_local,0x13);
        fptr_local._4_4_ = *(int *)colptr->ttype;
      }
      else {
        colptr->ttype[0] = -0x1e;
        colptr->ttype[1] = '\0';
        colptr->ttype[2] = '\0';
        colptr->ttype[3] = '\0';
        fptr_local._4_4_ = 0xe2;
      }
    }
    else {
      fptr_local._4_4_ = *(int *)colptr->ttype;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffsnul(fitsfile *fptr,      /* I - FITS file pointer                  */
           int colnum,          /* I - column number to apply nulvalue to */
           char *nulstring,     /* I - null pixel value: value of TNULLn  */
           int *status)         /* IO - error status                      */
/*
  Define the string used to represent undefined pixels in the ASCII TABLE
  column. This routine overrides the null  value given by the TNULLn keyword
  if present.  Note that this routine does not write or modify the TNULLn
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the TNULLn keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != ASCII_TBL)
        return(*status = NOT_ATABLE);        /* not proper HDU type */
 
    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    colptr->strnull[0] = '\0';
    strncat(colptr->strnull, nulstring, 19);  /* limit string to 19 chars */

    return(*status);
}